

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseTerminalType(ParseContext *ctx,bool *shrBorrow)

{
  Lexeme *begin;
  IntrusiveList<SynBase> types_00;
  SynIdentifier *pSVar1;
  SynIdentifier *pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  SynNamespaceElement *parent;
  undefined4 extraout_var;
  Lexeme *pLVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SynBase *pSVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Lexeme *pLVar9;
  LexemeType LVar10;
  InplaceStr IVar11;
  IntrusiveList<SynBase> types;
  IntrusiveList<SynIdentifier> namespacePath;
  
  begin = ctx->currentLexeme;
  LVar10 = begin->type;
  if (LVar10 == lex_generic) {
    ctx->currentLexeme = begin + 1;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pLVar7 = ParseContext::Previous(ctx);
    SynTypeGeneric::SynTypeGeneric((SynTypeGeneric *)CONCAT44(extraout_var_05,iVar4),begin,pLVar7);
    return (SynBase *)CONCAT44(extraout_var_05,iVar4);
  }
  if (LVar10 == lex_auto) {
    ctx->currentLexeme = begin + 1;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pLVar7 = ParseContext::Previous(ctx);
    SynTypeAuto::SynTypeAuto((SynTypeAuto *)CONCAT44(extraout_var_00,iVar4),begin,pLVar7);
    return (SynBase *)CONCAT44(extraout_var_00,iVar4);
  }
  if (LVar10 == lex_typeof) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_oparen,"ERROR: typeof must be followed by \'(\'")
    ;
    pSVar8 = ParseAssignment(ctx);
    if (pSVar8 == (SynBase *)0x0) {
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after typeof(");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar8 = (SynBase *)CONCAT44(extraout_var_03,iVar4);
      SynError::SynError((SynError *)pSVar8,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in typeof");
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pLVar7 = ParseContext::Previous(ctx);
    SynTypeof::SynTypeof((SynTypeof *)CONCAT44(extraout_var_04,iVar4),begin,pLVar7,pSVar8);
    pSVar8 = ParsePostExpressions(ctx,(SynBase *)CONCAT44(extraout_var_04,iVar4));
    return pSVar8;
  }
  if (LVar10 == lex_at) {
    ctx->currentLexeme = begin + 1;
    if (begin[1].type == lex_string) {
      IVar11 = ParseContext::Consume(ctx);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar7 = ParseContext::Previous(ctx);
      pLVar9 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var_01,iVar4),pLVar7,pLVar9,IVar11);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pLVar7 = ParseContext::Previous(ctx);
      SynTypeAlias::SynTypeAlias
                ((SynTypeAlias *)CONCAT44(extraout_var_02,iVar6),begin,pLVar7,
                 (SynIdentifier *)CONCAT44(extraout_var_01,iVar4));
      return &((SynTypeAlias *)CONCAT44(extraout_var_02,iVar6))->super_SynBase;
    }
    ctx->currentLexeme = begin;
  }
  else if (LVar10 == lex_string) {
    IVar11 = ParseContext::Consume(ctx);
    namespacePath.head = (SynIdentifier *)0x0;
    namespacePath.tail = (SynIdentifier *)0x0;
    parent = (SynNamespaceElement *)0x0;
    while ((ctx->currentLexeme->type == lex_point &&
           (parent = ParseContext::IsNamespace(ctx,parent,IVar11),
           parent != (SynNamespaceElement *)0x0))) {
      if (ctx->currentLexeme->type != lex_none) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
      bVar3 = anon_unknown.dwarf_147a9::CheckAt
                        (ctx,lex_string,"ERROR: namespace member is expected after \'.\'");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar7 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var,iVar4),begin,pLVar7,IVar11);
      IntrusiveList<SynIdentifier>::push_back
                (&namespacePath,(SynIdentifier *)CONCAT44(extraout_var,iVar4));
      if (!bVar3) break;
      IVar11 = ParseContext::Consume(ctx);
    }
    if (ctx->currentLexeme->type != lex_less) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
      pSVar8 = (SynBase *)CONCAT44(extraout_var_06,iVar4);
      pLVar7 = ParseContext::Previous(ctx);
      pSVar2 = namespacePath.tail;
      pSVar1 = namespacePath.head;
      SynBase::SynBase(pSVar8,7,begin,pLVar7);
      pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f108;
      pSVar8[1]._vptr_SynBase = (_func_int **)pSVar1;
      *(SynIdentifier **)&pSVar8[1].typeID = pSVar2;
      pSVar8[1].begin = (Lexeme *)IVar11.begin;
      pSVar8[1].end = (Lexeme *)IVar11.end;
      return pSVar8;
    }
    ctx->currentLexeme = ctx->currentLexeme + 1;
    types.head = (SynBase *)0x0;
    types.tail = (SynBase *)0x0;
    pSVar8 = ParseType(ctx,shrBorrow,false);
    if (pSVar8 == (SynBase *)0x0) {
      if (ctx->currentLexeme->type == lex_greater) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: typename required after \'<\'");
      }
    }
    else {
      do {
        IntrusiveList<SynBase>::push_back(&types,pSVar8);
        pLVar7 = ctx->currentLexeme;
        LVar10 = pLVar7->type;
        if (LVar10 != lex_comma) goto LAB_001117c8;
        ctx->currentLexeme = pLVar7 + 1;
        pSVar8 = ParseType(ctx,shrBorrow,false);
      } while (pSVar8 != (SynBase *)0x0);
      anon_unknown.dwarf_147a9::Report
                (ctx,ctx->currentLexeme,"ERROR: typename required after \',\'");
      pLVar7 = ctx->currentLexeme;
      LVar10 = pLVar7->type;
LAB_001117c8:
      if (LVar10 == lex_shr) {
        bVar3 = *shrBorrow;
        if (bVar3 == true) {
          ctx->currentLexeme = pLVar7 + 1;
        }
        *shrBorrow = (bool)(bVar3 ^ 1);
LAB_001118fd:
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pLVar7 = ParseContext::Previous(ctx);
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
        pSVar8 = (SynBase *)CONCAT44(extraout_var_08,iVar6);
        pLVar9 = ParseContext::Previous(ctx);
        pSVar2 = namespacePath.tail;
        pSVar1 = namespacePath.head;
        SynBase::SynBase(pSVar8,7,begin,pLVar9);
        pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f108;
        pSVar8[1]._vptr_SynBase = (_func_int **)pSVar1;
        *(SynIdentifier **)&pSVar8[1].typeID = pSVar2;
        pSVar8[1].begin = (Lexeme *)IVar11.begin;
        pSVar8[1].end = (Lexeme *)IVar11.end;
        types_00.tail = types.tail;
        types_00.head = types.head;
        SynTypeGenericInstance::SynTypeGenericInstance
                  ((SynTypeGenericInstance *)CONCAT44(extraout_var_07,iVar4),begin,pLVar7,pSVar8,
                   types_00);
        return &((SynTypeGenericInstance *)CONCAT44(extraout_var_07,iVar4))->super_SynBase;
      }
      if (LVar10 == lex_greater) {
        ctx->currentLexeme = pLVar7 + 1;
        goto LAB_001118fd;
      }
      uVar5 = IntrusiveList<SynBase>::size(&types);
      if (1 < uVar5) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: \'>\' expected after generic type alias list");
        goto LAB_001118fd;
      }
    }
    ctx->currentLexeme = begin;
  }
  return (SynBase *)0x0;
}

Assistant:

SynBase* ParseTerminalType(ParseContext &ctx, bool &shrBorrow)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();

		IntrusiveList<SynIdentifier> namespacePath;

		SynNamespaceElement *ns = NULL;

		while(ctx.At(lex_point) && (ns = ctx.IsNamespace(ns, name)) != NULL)
		{
			ctx.Skip();

			if(!CheckAt(ctx, lex_string, "ERROR: namespace member is expected after '.'"))
			{
				namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

				break;
			}

			namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

			name = ctx.Consume();
		}

		if(ctx.Consume(lex_less))
		{
			IntrusiveList<SynBase> types;

			SynBase *type = ParseType(ctx, &shrBorrow);

			if(!type)
			{
				if(ctx.Peek() == lex_greater)
					Report(ctx, ctx.Current(), "ERROR: typename required after '<'");

				// Backtrack
				ctx.currentLexeme = start;

				return NULL;
			}

			types.push_back(type);

			while(ctx.Consume(lex_comma))
			{
				type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					Report(ctx, ctx.Current(), "ERROR: typename required after ','");

					break;
				}

				types.push_back(type);
			}

			bool closed = ctx.Consume(lex_greater);

			if(!closed && ctx.At(lex_shr))
			{
				if(shrBorrow)
					ctx.Skip();

				shrBorrow = !shrBorrow;

				closed = true;
			}

			if(!closed)
			{
				if(types.size() > 1)
				{
					Report(ctx, ctx.Current(), "ERROR: '>' expected after generic type alias list");
				}
				else
				{
					// Backtrack
					ctx.currentLexeme = start;

					return NULL;
				}
			}

			return new (ctx.get<SynTypeGenericInstance>()) SynTypeGenericInstance(start, ctx.Previous(), new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name), types);
		}

		return new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name);
	}

	if(ctx.Consume(lex_auto))
		return new (ctx.get<SynTypeAuto>()) SynTypeAuto(start, ctx.Previous());

	if(ctx.Consume(lex_generic))
		return new (ctx.get<SynTypeGeneric>()) SynTypeGeneric(start, ctx.Previous());

	if(ctx.Consume(lex_typeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: typeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after typeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in typeof");

		SynBase *node = new (ctx.get<SynTypeof>()) SynTypeof(start, ctx.Previous(), value);

		return ParsePostExpressions(ctx, node);
	}

	if(ctx.Consume(lex_at))
	{
		if(!ctx.At(lex_string))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		return new (ctx.get<SynTypeAlias>()) SynTypeAlias(start, ctx.Previous(), nameIdentifier);
	}

	return NULL;
}